

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O0

void __thiscall
uWS::WebSocket<false,_true>::end(WebSocket<false,_true> *this,int code,string_view message)

{
  basic_string_view<char,_std::char_traits<char>_> args_2;
  bool bVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  int __how;
  TopicTree *in_RDX;
  undefined2 in_SI;
  int __fd;
  WebSocket<false,_true> *in_RDI;
  WebSocketContextData<false> *webSocketContextData;
  WebSocket<false,_true> *webSocket;
  bool ok;
  int closePayloadLength;
  char closePayload [125];
  int length;
  WebSocketData *webSocketData;
  char *in_stack_fffffffffffffed8;
  AsyncSocket<false> *in_stack_fffffffffffffee0;
  int args_1;
  void *pvVar6;
  WebSocket<false,_true> *args;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 uVar7;
  AsyncSocket<false> *subscriber;
  TopicTree *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  byte local_cd;
  int local_cc;
  WebSocket<false,_true> local_c8 [136];
  size_type local_40;
  unsigned_long local_38;
  undefined4 local_2c;
  long local_28;
  undefined2 local_1c;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = (size_t)in_RDX;
  local_1c = in_SI;
  local_28 = us_socket_ext(0);
  if ((*(byte *)(local_28 + 0x5c) & 1) == 0) {
    *(undefined1 *)(local_28 + 0x5c) = 1;
    local_38 = 0x7b;
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_10);
    puVar2 = std::min<unsigned_long>(&local_38,&local_40);
    local_2c = (undefined4)*puVar2;
    args = local_c8;
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    sVar3 = protocol::formatClosePayload
                      ((char *)args,(uint16_t)((ulong)in_stack_fffffffffffffee0 >> 0x30),
                       in_stack_fffffffffffffed8,0x24f851);
    local_cc = (int)sVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e0,(char *)local_c8,(long)local_cc);
    __fd = (int)local_e0._M_len;
    sVar4 = send(in_RDI,(int)local_e0._M_len,local_e0._M_str,8,0);
    local_cd = (byte)sVar4 & 1;
    subscriber = (AsyncSocket<false> *)in_RDI;
    bVar1 = AsyncSocket<false>::isCorked(in_stack_fffffffffffffee0);
    args_1 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    uVar7 = local_1c;
    if ((!bVar1) && ((local_cd & 1) != 0)) {
      AsyncSocket<false>::shutdown((AsyncSocket<false> *)in_RDI,__fd,__how);
      uVar7 = local_1c;
    }
    uVar5 = us_socket_context(0,subscriber);
    us_socket_context_ext(0,uVar5);
    bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                      ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
                        *)0x24f8e2);
    if (bVar1) {
      args_2._M_str = (char *)local_10._M_len;
      args_2._M_len = (size_t)subscriber;
      fu2::abi_400::detail::type_erasure::invocation_table::
      operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)CONCAT26(uVar7,in_stack_fffffffffffffef0),args,args_1,args_2);
      in_stack_ffffffffffffff00 = (TopicTree *)local_10._M_len;
    }
    TopicTree::unsubscribeAll(in_stack_ffffffffffffff00,(Subscriber *)subscriber);
    pvVar6 = *(void **)(local_28 + 0x68);
    if (pvVar6 != (void *)0x0) {
      Subscriber::~Subscriber((Subscriber *)0x24f964);
      operator_delete(pvVar6,0x20);
    }
    *(undefined8 *)(local_28 + 0x68) = 0;
  }
  return;
}

Assistant:

void end(int code, std::string_view message = {}) {
        /* Check if we already called this one */
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) this);
        if (webSocketData->isShuttingDown) {
            return;
        }

        /* We postpone any FIN sending to either drainage or uncorking */
        webSocketData->isShuttingDown = true;

        /* Format and send the close frame */
        static const int MAX_CLOSE_PAYLOAD = 123;
        int length = (int) std::min<size_t>(MAX_CLOSE_PAYLOAD, message.length());
        char closePayload[MAX_CLOSE_PAYLOAD + 2];
        int closePayloadLength = (int) protocol::formatClosePayload(closePayload, (uint16_t) code, message.data(), length);
        bool ok = send(std::string_view(closePayload, closePayloadLength), OpCode::CLOSE);

        /* FIN if we are ok and not corked */
        WebSocket<SSL, true> *webSocket = (WebSocket<SSL, true> *) this;
        if (!webSocket->isCorked()) {
            if (ok) {
                /* If we are not corked, and we just sent off everything, we need to FIN right here.
                 * In all other cases, we need to fin either if uncork was successful, or when drainage is complete. */
                webSocket->shutdown();
            }
        }

        /* Emit close event */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL,
            (us_socket_context_t *) us_socket_context(SSL, (us_socket_t *) this)
        );
        if (webSocketContextData->closeHandler) {
            webSocketContextData->closeHandler(this, code, message);
        }

        /* Make sure to unsubscribe from any pub/sub node at exit */
        webSocketContextData->topicTree.unsubscribeAll(webSocketData->subscriber);
        delete webSocketData->subscriber;
        webSocketData->subscriber = nullptr;
    }